

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwht4x4_sse4_1(int16_t *input,tran_low_t *output,int stride)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar8;
  int iVar9;
  undefined1 in_XMM0 [16];
  undefined1 auVar5 [16];
  int iVar10;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar11;
  int iVar14;
  int iVar15;
  undefined1 in_XMM1 [16];
  undefined1 auVar12 [16];
  int iVar16;
  undefined1 auVar13 [16];
  int iVar17;
  int iVar20;
  int iVar21;
  undefined1 in_XMM2 [16];
  undefined1 auVar18 [16];
  int iVar22;
  undefined1 auVar19 [16];
  int iVar23;
  int iVar26;
  int iVar27;
  undefined1 in_XMM3 [16];
  undefined1 auVar24 [16];
  int iVar28;
  undefined1 auVar25 [16];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  
  auVar5 = pmovsxwd(in_XMM0,*(undefined8 *)input);
  auVar24 = pmovsxwd(in_XMM3,*(undefined8 *)(input + stride));
  auVar18 = pmovsxwd(in_XMM2,*(undefined8 *)(input + stride * 2));
  auVar12 = pmovsxwd(in_XMM1,*(undefined8 *)(input + stride * 3));
  iVar2 = 2;
  while( true ) {
    iVar1 = iVar2 + -1;
    iVar23 = auVar24._0_4_;
    iVar17 = auVar18._0_4_;
    iVar26 = auVar24._4_4_;
    iVar20 = auVar18._4_4_;
    iVar28 = auVar24._12_4_;
    iVar22 = auVar18._12_4_;
    iVar27 = auVar24._8_4_;
    iVar21 = auVar18._8_4_;
    if (iVar2 == 0) break;
    iVar4 = auVar5._0_4_ + iVar23;
    iVar8 = auVar5._4_4_ + iVar26;
    iVar9 = auVar5._8_4_ + iVar27;
    iVar10 = auVar5._12_4_ + iVar28;
    iVar11 = auVar12._0_4_ - iVar17;
    iVar14 = auVar12._4_4_ - iVar20;
    iVar15 = auVar12._8_4_ - iVar21;
    iVar16 = auVar12._12_4_ - iVar22;
    iVar29 = iVar4 - iVar11 >> 1;
    iVar30 = iVar8 - iVar14 >> 1;
    iVar31 = iVar9 - iVar15 >> 1;
    iVar32 = iVar10 - iVar16 >> 1;
    auVar12._0_4_ = iVar29 - iVar23;
    auVar12._4_4_ = iVar30 - iVar26;
    auVar12._8_4_ = iVar31 - iVar27;
    auVar12._12_4_ = iVar32 - iVar28;
    auVar24._0_4_ = iVar29 - iVar17;
    auVar24._4_4_ = iVar30 - iVar20;
    auVar24._8_4_ = iVar31 - iVar21;
    auVar24._12_4_ = iVar32 - iVar22;
    iVar4 = iVar4 - auVar24._0_4_;
    iVar8 = iVar8 - auVar24._4_4_;
    auVar6._0_8_ = CONCAT44(iVar8,iVar4);
    auVar6._8_4_ = iVar9 - auVar24._8_4_;
    auVar6._12_4_ = iVar10 - auVar24._12_4_;
    iVar11 = iVar11 + auVar12._0_4_;
    iVar14 = iVar14 + auVar12._4_4_;
    auVar18._0_8_ = CONCAT44(iVar14,iVar11);
    auVar18._8_4_ = iVar15 + auVar12._8_4_;
    auVar18._12_4_ = iVar16 + auVar12._12_4_;
    bVar3 = iVar2 == 2;
    auVar5 = auVar6;
    iVar2 = iVar1;
    if (bVar3) {
      auVar19._8_4_ = iVar8;
      auVar19._0_8_ = auVar6._0_8_;
      auVar19._12_4_ = auVar24._4_4_;
      auVar5._4_4_ = auVar24._0_4_;
      auVar5._0_4_ = iVar4;
      auVar25._8_4_ = iVar14;
      auVar25._0_8_ = auVar18._0_8_;
      auVar25._12_4_ = auVar12._4_4_;
      auVar5._12_4_ = auVar12._0_4_;
      auVar5._8_4_ = iVar11;
      auVar7._0_8_ = CONCAT44(auVar24._8_4_,auVar6._8_4_);
      auVar7._8_4_ = auVar6._12_4_;
      auVar7._12_4_ = auVar24._12_4_;
      auVar13._0_8_ = CONCAT44(auVar12._8_4_,auVar18._8_4_);
      auVar13._8_4_ = auVar18._12_4_;
      auVar13._12_4_ = auVar12._12_4_;
      auVar24._8_8_ = auVar25._8_8_;
      auVar24._0_8_ = auVar19._8_8_;
      auVar18._8_8_ = auVar13._0_8_;
      auVar18._0_8_ = auVar7._0_8_;
      auVar12._8_8_ = auVar13._8_8_;
      auVar12._0_8_ = auVar7._8_8_;
    }
  }
  *output = auVar5._0_4_ << 2;
  output[1] = auVar5._4_4_ << 2;
  output[2] = auVar5._8_4_ << 2;
  output[3] = auVar5._12_4_ << 2;
  output[4] = iVar23 << 2;
  output[5] = iVar26 << 2;
  output[6] = iVar27 << 2;
  output[7] = iVar28 << 2;
  output[8] = iVar17 << 2;
  output[9] = iVar20 << 2;
  output[10] = iVar21 << 2;
  output[0xb] = iVar22 << 2;
  output[0xc] = auVar12._0_4_ << 2;
  output[0xd] = auVar12._4_4_ << 2;
  output[0xe] = auVar12._8_4_ << 2;
  output[0xf] = auVar12._12_4_ << 2;
  return;
}

Assistant:

void av1_fwht4x4_sse4_1(const int16_t *input, tran_low_t *output, int stride) {
  __m128i in[4];
  in[0] = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
  in[1] = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
  in[2] = _mm_loadl_epi64((const __m128i *)(input + 2 * stride));
  in[3] = _mm_loadl_epi64((const __m128i *)(input + 3 * stride));

  // Convert to int32_t.
  __m128i op[4];
  op[0] = _mm_cvtepi16_epi32(in[0]);
  op[1] = _mm_cvtepi16_epi32(in[1]);
  op[2] = _mm_cvtepi16_epi32(in[2]);
  op[3] = _mm_cvtepi16_epi32(in[3]);

  for (int i = 0; i < 2; ++i) {
    __m128i a1 = op[0];
    __m128i b1 = op[1];
    __m128i c1 = op[2];
    __m128i d1 = op[3];
    __m128i e1;

    a1 = _mm_add_epi32(a1, b1);  // a1 += b1
    d1 = _mm_sub_epi32(d1, c1);  // d1 = d1 - c1
    e1 = _mm_sub_epi32(a1, d1);  // e1 = (a1 - d1) >> 1
    e1 = _mm_srai_epi32(e1, 1);
    b1 = _mm_sub_epi32(e1, b1);  // b1 = e1 - b1
    c1 = _mm_sub_epi32(e1, c1);  // c1 = e1 - c1
    a1 = _mm_sub_epi32(a1, c1);  // a1 -= c1
    d1 = _mm_add_epi32(d1, b1);  // d1 += b1

    op[0] = a1;
    op[1] = c1;
    op[2] = d1;
    op[3] = b1;

    if (i == 0) {
      transpose_32bit_4x4(op, op);
    }
  }

  op[0] = _mm_slli_epi32(op[0], UNIT_QUANT_SHIFT);
  op[1] = _mm_slli_epi32(op[1], UNIT_QUANT_SHIFT);
  op[2] = _mm_slli_epi32(op[2], UNIT_QUANT_SHIFT);
  op[3] = _mm_slli_epi32(op[3], UNIT_QUANT_SHIFT);

  _mm_storeu_si128((__m128i *)(output + 0), op[0]);
  _mm_storeu_si128((__m128i *)(output + 4), op[1]);
  _mm_storeu_si128((__m128i *)(output + 8), op[2]);
  _mm_storeu_si128((__m128i *)(output + 12), op[3]);
}